

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O3

void SHRotateXPlus(rot_data_t *c_in,rot_data_t *c_out,int lmax)

{
  *c_out = *c_in;
  if (0 < lmax) {
    c_out[1] = c_in[2];
    c_out[2] = -c_in[1];
    c_out[3] = c_in[3];
    if (lmax != 1) {
      c_out[4] = c_in[7];
      c_out[5] = -c_in[5];
      c_out[6] = c_in[6] * -0.5 + c_in[8] * -0.8660254;
      c_out[7] = -c_in[4];
      c_out[8] = c_in[6] * -0.8660254 + c_in[8] * 0.5;
      if (2 < (uint)lmax) {
        c_out[9] = c_in[0xc] * -0.7905694 + c_in[0xe] * 0.61237246;
        c_out[10] = -c_in[10];
        c_out[0xb] = c_in[0xc] * -0.61237246 + c_in[0xe] * -0.7905694;
        c_out[0xc] = c_in[9] * 0.7905694 + c_in[0xb] * 0.61237246;
        c_out[0xd] = c_in[0xd] * -0.25 + c_in[0xf] * -0.96824586;
        c_out[0xe] = c_in[9] * -0.61237246 + c_in[0xb] * 0.7905694;
        c_out[0xf] = c_in[0xd] * -0.96824586 + c_in[0xf] * 0.25;
        if (lmax != 3) {
          c_out[0x10] = c_in[0x15] * -0.9354144 + c_in[0x17] * 0.35355338;
          c_out[0x11] = c_in[0x11] * -0.75 + c_in[0x13] * 0.6614378;
          c_out[0x12] = c_in[0x15] * -0.35355338 + c_in[0x17] * -0.9354144;
          c_out[0x13] = c_in[0x11] * 0.6614378 + c_in[0x13] * 0.75;
          c_out[0x14] = c_in[0x18] * 0.73951 + c_in[0x14] * 0.375 + c_in[0x16] * 0.559017;
          c_out[0x15] = c_in[0x10] * 0.9354144 + c_in[0x12] * 0.35355338;
          c_out[0x16] = c_in[0x18] * -0.6614378 + c_in[0x14] * 0.559017 + c_in[0x16] * 0.5;
          c_out[0x17] = c_in[0x10] * -0.35355338 + c_in[0x12] * 0.9354144;
          c_out[0x18] = c_in[0x18] * 0.125 + c_in[0x14] * 0.73951 + c_in[0x16] * -0.6614378;
          if (4 < (uint)lmax) {
            c_out[0x19] = c_in[0x22] * 0.19764236 +
                          c_in[0x1e] * 0.70156074 + c_in[0x20] * -0.6846532;
            c_out[0x1a] = c_in[0x1a] * -0.5 + c_in[0x1c] * 0.8660254;
            c_out[0x1b] = c_in[0x22] * -0.79549515 +
                          c_in[0x1e] * 0.5229125 + c_in[0x20] * 0.30618623;
            c_out[0x1c] = c_in[0x1a] * 0.8660254 + c_in[0x1c] * 0.5;
            c_out[0x1d] = c_in[0x22] * 0.572822 + c_in[0x1e] * 0.48412293 + c_in[0x20] * 0.6614378;
            c_out[0x1e] = c_in[0x1d] * -0.48412293 +
                          c_in[0x19] * -0.70156074 + c_in[0x1b] * -0.5229125;
            c_out[0x1f] = c_in[0x23] * 0.90571105 + c_in[0x1f] * 0.125 + c_in[0x21] * 0.40504628;
            c_out[0x20] = c_in[0x1d] * -0.6614378 +
                          c_in[0x19] * 0.6846532 + c_in[0x1b] * -0.30618623;
            c_out[0x21] = c_in[0x23] * -0.41926274 + c_in[0x1f] * 0.40504628 + c_in[0x21] * 0.8125;
            c_out[0x22] = c_in[0x1d] * -0.572822 +
                          c_in[0x19] * -0.19764236 + c_in[0x1b] * 0.79549515;
            c_out[0x23] = c_in[0x23] * 0.0625 + c_in[0x1f] * 0.90571105 + c_in[0x21] * -0.41926274;
            if (lmax != 5) {
              c_out[0x24] = c_in[0x2f] * 0.10825317 +
                            c_in[0x2b] * 0.87945294 + c_in[0x2d] * -0.4635124;
              c_out[0x25] = c_in[0x29] * -0.5077524 + c_in[0x25] * -0.3125 + c_in[0x27] * 0.80282706
              ;
              c_out[0x26] = c_in[0x2f] * -0.586302 + c_in[0x2b] * 0.4330127 + c_in[0x2d] * 0.6846532
              ;
              c_out[0x27] = c_in[0x29] * -0.59292704 +
                            c_in[0x25] * 0.80282706 + c_in[0x27] * -0.0625;
              c_out[0x28] = c_in[0x2f] * 0.80282706 + c_in[0x2b] * 0.19764236 + c_in[0x2d] * 0.5625;
              c_out[0x29] = c_in[0x29] * -0.625 + c_in[0x25] * -0.5077524 + c_in[0x27] * -0.59292704
              ;
              c_out[0x2a] = c_in[0x30] * -0.67169327 +
                            c_in[0x2e] * -0.49607837 +
                            c_in[0x2a] * -0.3125 + c_in[0x2c] * -0.45285553;
              c_out[0x2b] = c_in[0x28] * -0.19764236 +
                            c_in[0x24] * -0.87945294 + c_in[0x26] * -0.4330127;
              c_out[0x2c] = c_in[0x30] * 0.69526863 +
                            c_in[0x2e] * -0.1711633 +
                            c_in[0x2a] * -0.45285553 + c_in[0x2c] * -0.53125;
              c_out[0x2d] = c_in[0x28] * -0.5625 + c_in[0x24] * 0.4635124 + c_in[0x26] * -0.6846532;
              c_out[0x2e] = c_in[0x30] * -0.2538762 +
                            c_in[0x2e] * 0.8125 + c_in[0x2a] * -0.49607837 + c_in[0x2c] * -0.1711633
              ;
              c_out[0x2f] = c_in[0x28] * -0.80282706 +
                            c_in[0x24] * -0.10825317 + c_in[0x26] * 0.586302;
              c_out[0x30] = c_in[0x30] * 0.03125 +
                            c_in[0x2e] * -0.2538762 +
                            c_in[0x2a] * -0.67169327 + c_in[0x2c] * 0.69526863;
              if (6 < (uint)lmax) {
                c_out[0x31] = c_in[0x3e] * 0.0584634 +
                              c_in[0x3c] * -0.298106 +
                              c_in[0x38] * -0.64725983 + c_in[0x3a] * 0.6991205;
                c_out[0x32] = c_in[0x36] * -0.7473913 +
                              c_in[0x32] * -0.1875 + c_in[0x34] * 0.63737744;
                c_out[0x33] = c_in[0x3e] * -0.3983609 +
                              c_in[0x3c] * 0.78125 +
                              c_in[0x38] * -0.47495887 + c_in[0x3a] * -0.07328775;
                c_out[0x34] = c_in[0x36] * -0.586302 + c_in[0x32] * 0.63737744 + c_in[0x34] * -0.5;
                c_out[0x35] = c_in[0x3e] * 0.7927282 +
                              c_in[0x3c] * 0.10364453 +
                              c_in[0x38] * -0.42961648 + c_in[0x3a] * -0.41984466;
                c_out[0x36] = c_in[0x36] * -0.3125 +
                              c_in[0x32] * -0.7473913 + c_in[0x34] * -0.586302;
                c_out[0x37] = c_in[0x3e] * -0.45768183 +
                              c_in[0x3c] * -0.53855276 +
                              c_in[0x38] * -0.41339865 + c_in[0x3a] * -0.5740992;
                c_out[0x38] = c_in[0x37] * 0.41339865 +
                              c_in[0x35] * 0.42961648 +
                              c_in[0x31] * 0.64725983 + c_in[0x33] * 0.47495887;
                c_out[0x39] = c_in[0x3f] * -0.8562443 +
                              c_in[0x3d] * -0.44879395 +
                              c_in[0x39] * -0.078125 + c_in[0x3b] * -0.24356964;
                c_out[0x3a] = c_in[0x37] * 0.5740992 +
                              c_in[0x35] * 0.41984466 +
                              c_in[0x31] * -0.6991205 + c_in[0x33] * 0.07328775;
                c_out[0x3b] = c_in[0x3f] * 0.49435288 +
                              c_in[0x3d] * -0.5700449 +
                              c_in[0x39] * -0.24356964 + c_in[0x3b] * -0.609375;
                c_out[0x3c] = c_in[0x37] * 0.53855276 +
                              c_in[0x35] * -0.10364453 +
                              c_in[0x31] * 0.298106 + c_in[0x33] * -0.78125;
                c_out[0x3d] = c_in[0x3f] * -0.149053 +
                              c_in[0x3d] * 0.671875 +
                              c_in[0x39] * -0.44879395 + c_in[0x3b] * -0.5700449;
                c_out[0x3e] = c_in[0x37] * 0.45768183 +
                              c_in[0x35] * -0.7927282 +
                              c_in[0x31] * -0.0584634 + c_in[0x33] * 0.3983609;
                c_out[0x3f] = c_in[0x3f] * 0.015625 +
                              c_in[0x3d] * -0.149053 +
                              c_in[0x39] * -0.8562443 + c_in[0x3b] * 0.49435288;
                if (lmax != 7) {
                  c_out[0x40] = c_in[0x4f] * 0.03125 +
                                c_in[0x4d] * -0.1848775 +
                                c_in[0x49] * -0.8356089 + c_in[0x4b] * 0.5163347;
                  c_out[0x41] = c_in[0x47] * 0.41780445 +
                                c_in[0x45] * -0.7745021 +
                                c_in[0x41] * -0.109375 + c_in[0x43] * 0.46219373;
                  c_out[0x42] = c_in[0x4f] * -0.25674495 +
                                c_in[0x4d] * 0.708831 +
                                c_in[0x49] * -0.45768183 + c_in[0x4b] * -0.47134697;
                  c_out[0x43] = c_in[0x47] * 0.49435288 +
                                c_in[0x45] * -0.21819125 +
                                c_in[0x41] * 0.46219373 + c_in[0x43] * -0.703125;
                  c_out[0x44] = c_in[0x4f] * 0.66658527 +
                                c_in[0x4d] * -0.33802044 +
                                c_in[0x49] * -0.27421764 + c_in[0x4b] * -0.6051536;
                  c_out[0x45] = c_in[0x47] * 0.53102016 +
                                c_in[0x45] * 0.265625 +
                                c_in[0x41] * -0.7745021 + c_in[0x43] * -0.21819125;
                  c_out[0x46] = c_in[0x4f] * -0.6991205 +
                                c_in[0x4d] * -0.5908647 +
                                c_in[0x49] * -0.13072813 + c_in[0x4b] * -0.3808143;
                  c_out[0x47] = c_in[0x47] * 0.546875 +
                                c_in[0x45] * 0.53102016 +
                                c_in[0x41] * 0.41780445 + c_in[0x43] * 0.49435288;
                  c_out[0x48] = c_in[0x50] * 0.62670666 +
                                c_in[0x4e] * 0.45768183 +
                                c_in[0x4c] * 0.41132647 +
                                c_in[0x48] * 0.2734375 + c_in[0x4a] * 0.39218438;
                  c_out[0x49] = c_in[0x46] * 0.13072813 +
                                c_in[0x44] * 0.27421764 +
                                c_in[0x40] * 0.8356089 + c_in[0x42] * 0.45768183;
                  c_out[0x4a] = c_in[0x50] * -0.6991205 +
                                c_in[0x4c] * 0.32775277 + c_in[0x48] * 0.39218438 + c_in[0x4a] * 0.5
                  ;
                  c_out[0x4b] = c_in[0x46] * 0.3808143 +
                                c_in[0x44] * 0.6051536 +
                                c_in[0x40] * -0.5163347 + c_in[0x42] * 0.47134697;
                  c_out[0x4c] = c_in[0x50] * 0.33329263 +
                                c_in[0x4e] * -0.73020756 +
                                c_in[0x4c] * -0.28125 +
                                c_in[0x48] * 0.41132647 + c_in[0x4a] * 0.32775277;
                  c_out[0x4d] = c_in[0x46] * 0.5908647 +
                                c_in[0x44] * 0.33802044 +
                                c_in[0x40] * 0.1848775 + c_in[0x42] * -0.708831;
                  c_out[0x4e] = c_in[0x50] * -0.08558165 +
                                c_in[0x4e] * 0.5 +
                                c_in[0x48] * 0.45768183 + c_in[0x4c] * -0.73020756;
                  c_out[0x4f] = c_in[0x46] * 0.6991205 +
                                c_in[0x44] * -0.66658527 +
                                c_in[0x40] * -0.03125 + c_in[0x42] * 0.25674495;
                  c_out[0x50] = c_in[0x50] * 0.0078125 +
                                c_in[0x4e] * -0.08558165 +
                                c_in[0x4c] * 0.33329263 +
                                c_in[0x48] * 0.62670666 + c_in[0x4a] * -0.6991205;
                  if (8 < (uint)lmax) {
                    c_out[0x51] = c_in[0x62] * 0.016572814 +
                                  c_in[0x60] * -0.11158482 +
                                  c_in[0x5e] * 0.36157614 +
                                  c_in[0x5a] * 0.6090494 + c_in[0x5c] * -0.69684696;
                    c_out[0x52] = c_in[0x58] * 0.6569936 +
                                  c_in[0x56] * -0.6817945 +
                                  c_in[0x52] * -0.0625 + c_in[0x54] * 0.3156095;
                    c_out[0x53] = c_in[0x62] * -0.15944009 +
                                  c_in[0x60] * 0.56832916 +
                                  c_in[0x5e] * -0.67232907 +
                                  c_in[0x5a] * 0.44314852 + c_in[0x5c] * -0.05633674;
                    c_out[0x54] = c_in[0x58] * 0.5854686 +
                                  c_in[0x56] * 0.20252314 +
                                  c_in[0x52] * 0.3156095 + c_in[0x54] * -0.71875;
                    c_out[0x55] = c_in[0x62] * 0.5093127 +
                                  c_in[0x60] * -0.6051536 +
                                  c_in[0x5e] * -0.39218438 +
                                  c_in[0x5a] * 0.3963641 + c_in[0x5c] * 0.25194556;
                    c_out[0x56] = c_in[0x58] * 0.42158556 +
                                  c_in[0x56] * 0.5625 +
                                  c_in[0x52] * -0.6817945 + c_in[0x54] * 0.20252314;
                    c_out[0x57] = c_in[0x62] * -0.7526808 +
                                  c_in[0x60] * -0.298106 +
                                  c_in[0x5e] * 0.13799626 +
                                  c_in[0x5a] * 0.37548795 + c_in[0x5c] * 0.42961648;
                    c_out[0x58] = c_in[0x58] * 0.21875 +
                                  c_in[0x56] * 0.42158556 +
                                  c_in[0x52] * 0.6569936 + c_in[0x54] * 0.5854686;
                    c_out[0x59] = c_in[0x62] * 0.38519666 +
                                  c_in[0x60] * 0.45768183 +
                                  c_in[0x5e] * 0.49435288 +
                                  c_in[0x5a] * 0.3668549 + c_in[0x5c] * 0.5130142;
                    c_out[0x5a] = c_in[0x59] * -0.3668549 +
                                  c_in[0x57] * -0.37548795 +
                                  c_in[0x55] * -0.3963641 +
                                  c_in[0x51] * -0.6090494 + c_in[0x53] * -0.44314852;
                    c_out[0x5b] = c_in[99] * 0.8171255 +
                                  c_in[0x61] * 0.46242478 +
                                  c_in[0x5f] * 0.29543236 +
                                  c_in[0x5b] * 0.0546875 + c_in[0x5d] * 0.16792332;
                    c_out[0x5c] = c_in[0x59] * -0.5130142 +
                                  c_in[0x57] * -0.42961648 +
                                  c_in[0x55] * -0.25194556 +
                                  c_in[0x51] * 0.69684696 + c_in[0x53] * 0.05633674;
                    c_out[0x5d] = c_in[99] * -0.53222567 +
                                  c_in[0x61] * 0.38725105 +
                                  c_in[0x5f] * 0.5772798 +
                                  c_in[0x5b] * 0.16792332 + c_in[0x5d] * 0.453125;
                    c_out[0x5e] = c_in[0x59] * -0.49435288 +
                                  c_in[0x57] * -0.13799626 +
                                  c_in[0x55] * 0.39218438 +
                                  c_in[0x51] * -0.36157614 + c_in[0x53] * 0.67232907;
                    c_out[0x5f] = c_in[99] * 0.21608308 +
                                  c_in[0x61] * -0.7162405 +
                                  c_in[0x5f] * 0.140625 +
                                  c_in[0x5b] * 0.29543236 + c_in[0x5d] * 0.5772798;
                    c_out[0x60] = c_in[0x59] * -0.45768183 +
                                  c_in[0x57] * 0.298106 +
                                  c_in[0x55] * 0.6051536 +
                                  c_in[0x51] * 0.11158482 + c_in[0x53] * -0.56832916;
                    c_out[0x61] = c_in[99] * -0.048317645 +
                                  c_in[0x61] * 0.34765625 +
                                  c_in[0x5f] * -0.7162405 +
                                  c_in[0x5b] * 0.46242478 + c_in[0x5d] * 0.38725105;
                    c_out[0x62] = c_in[0x59] * -0.38519666 +
                                  c_in[0x57] * 0.7526808 +
                                  c_in[0x55] * -0.5093127 +
                                  c_in[0x51] * -0.016572814 + c_in[0x53] * 0.15944009;
                    c_out[99] = c_in[99] * 0.00390625 +
                                c_in[0x61] * -0.048317645 +
                                c_in[0x5f] * 0.21608308 +
                                c_in[0x5b] * 0.8171255 + c_in[0x5d] * -0.53222567;
                    if (lmax != 9) {
                      __assert_fail("lmax < 10",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/sh/sh.cpp"
                                    ,0x1c3,
                                    "void SHRotateXPlus(const rot_data_t *, rot_data_t *, int)");
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SHRotateXPlus(const rot_data_t *c_in, rot_data_t *c_out, int lmax) {
#define O(l, m)  c_in[SHIndex(l, m)]

    // first band is a no-op
    *c_out++ = c_in[0];

    if (lmax < 1) return;
    *c_out++ = (O(1,0));
    *c_out++ = (-1.*O(1,-1));
    *c_out++ = (O(1,1));

    if (lmax < 2) return;
    *c_out++ = (O(2,1));
    *c_out++ = (-1.*O(2,-1));
    *c_out++ = (-0.5*O(2,0) - 0.8660254037844386*O(2,2));
    *c_out++ = (-1.*O(2,-2));
    *c_out++ = (-0.8660254037844386*O(2,0) + 0.5*O(2,2));

    // Remainder of SH $x+$ rotation definition
    if (lmax < 3) return;
    *c_out++ = (-0.7905694150420949*O(3,0) + 0.6123724356957945*O(3,2));
    *c_out++ = (-1.*O(3,-2));
    *c_out++ = (-0.6123724356957945*O(3,0) - 0.7905694150420949*O(3,2));
    *c_out++ = (0.7905694150420949*O(3,-3) + 0.6123724356957945*O(3,-1));
    *c_out++ = (-0.25*O(3,1) - 0.9682458365518543*O(3,3));
    *c_out++ = (-0.6123724356957945*O(3,-3) + 0.7905694150420949*O(3,-1));
    *c_out++ = (-0.9682458365518543*O(3,1) + 0.25*O(3,3));
    
    if (lmax < 4) return;
    *c_out++ = (-0.9354143466934853*O(4,1) + 0.35355339059327373*O(4,3));
    *c_out++ = (-0.75*O(4,-3) + 0.6614378277661477*O(4,-1));
    *c_out++ = (-0.35355339059327373*O(4,1) - 0.9354143466934853*O(4,3));
    *c_out++ = (0.6614378277661477*O(4,-3) + 0.75*O(4,-1));
    *c_out++ = (0.375*O(4,0) + 0.5590169943749475*O(4,2) + 0.739509972887452*O(4,4));
    *c_out++ = (0.9354143466934853*O(4,-4) + 0.35355339059327373*O(4,-2));
    *c_out++ = (0.5590169943749475*O(4,0) + 0.5*O(4,2) - 0.6614378277661477*O(4,4));
    *c_out++ = (-0.35355339059327373*O(4,-4) + 0.9354143466934853*O(4,-2));
    *c_out++ = (0.739509972887452*O(4,0) - 0.6614378277661477*O(4,2) + 0.125*O(4,4));
    
    if (lmax < 5) return;
    *c_out++ = (0.701560760020114*O(5,0) - 0.6846531968814576*O(5,2) +
                0.19764235376052372*O(5,4));
    *c_out++ = (-0.5*O(5,-4) + 0.8660254037844386*O(5,-2));
    *c_out++ = (0.5229125165837972*O(5,0) + 0.30618621784789724*O(5,2) -
                0.795495128834866*O(5,4));
    *c_out++ = (0.8660254037844386*O(5,-4) + 0.5*O(5,-2));
    *c_out++ = (0.4841229182759271*O(5,0) + 0.6614378277661477*O(5,2) +
                0.57282196186948*O(5,4));
    *c_out++ = (-0.701560760020114*O(5,-5) - 0.5229125165837972*O(5,-3) -
                0.4841229182759271*O(5,-1));
    *c_out++ = (0.125*O(5,1) + 0.4050462936504913*O(5,3) + 0.9057110466368399*O(5,5));
    *c_out++ = (0.6846531968814576*O(5,-5) - 0.30618621784789724*O(5,-3) -
                0.6614378277661477*O(5,-1));
    *c_out++ = (0.4050462936504913*O(5,1) + 0.8125*O(5,3) - 0.4192627457812106*O(5,5));
    *c_out++ = (-0.19764235376052372*O(5,-5) + 0.795495128834866*O(5,-3) -
                0.57282196186948*O(5,-1));
    *c_out++ = (0.9057110466368399*O(5,1) - 0.4192627457812106*O(5,3) + 0.0625*O(5,5));
    
    if (lmax < 6) return;
    *c_out++ = (0.879452954966893*O(6,1) - 0.46351240544347894*O(6,3) +
                0.10825317547305482*O(6,5));
    *c_out++ = (-0.3125*O(6,-5) + 0.8028270361665706*O(6,-3) - 0.5077524002897476*O(6,-1));
    *c_out++ = (0.4330127018922193*O(6,1) + 0.6846531968814576*O(6,3) -
                0.5863019699779287*O(6,5));
    *c_out++ = (0.8028270361665706*O(6,-5) - 0.0625*O(6,-3) - 0.5929270612815711*O(6,-1));
    *c_out++ = (0.19764235376052372*O(6,1) + 0.5625*O(6,3) + 0.8028270361665706*O(6,5));
    *c_out++ = (-0.5077524002897476*O(6,-5) - 0.5929270612815711*O(6,-3) -
                0.625*O(6,-1));
    *c_out++ = (-0.3125*O(6,0) - 0.45285552331841994*O(6,2) - 0.49607837082461076*O(6,4) -
                0.6716932893813962*O(6,6));
    *c_out++ = (-0.879452954966893*O(6,-6) - 0.4330127018922193*O(6,-4) -
                0.19764235376052372*O(6,-2));
    *c_out++ = (-0.45285552331841994*O(6,0) - 0.53125*O(6,2) - 0.1711632992203644*O(6,4) +
                0.6952686081652184*O(6,6));
    *c_out++ = (0.46351240544347894*O(6,-6) - 0.6846531968814576*O(6,-4) -
                0.5625*O(6,-2));
    *c_out++ = (-0.49607837082461076*O(6,0) - 0.1711632992203644*O(6,2) +
                0.8125*O(6,4) - 0.2538762001448738*O(6,6));
    *c_out++ = (-0.10825317547305482*O(6,-6) + 0.5863019699779287*O(6,-4) -
                0.8028270361665706*O(6,-2));
    *c_out++ = (-0.6716932893813962*O(6,0) + 0.6952686081652184*O(6,2) -
                0.2538762001448738*O(6,4) + 0.03125*O(6,6));
    
    if (lmax < 7) return;
    *c_out++ = (-0.6472598492877494*O(7,0) + 0.6991205412874092*O(7,2) -
                0.2981060004427955*O(7,4) + 0.05846339666834283*O(7,6));
    *c_out++ = (-0.1875*O(7,-6) + 0.6373774391990981*O(7,-4) - 0.7473912964438374*O(7,-2));
    *c_out++ = (-0.47495887979908324*O(7,0) - 0.07328774624724109*O(7,2) +
                0.78125*O(7,4) - 0.3983608994994363*O(7,6));
    *c_out++ = (0.6373774391990981*O(7,-6) - 0.5*O(7,-4) - 0.5863019699779287*O(7,-2));
    *c_out++ = (-0.42961647140211*O(7,0) - 0.41984465132951254*O(7,2) +
                0.10364452469860624*O(7,4) + 0.7927281808728639*O(7,6));
    *c_out++ = (-0.7473912964438374*O(7,-6) - 0.5863019699779287*O(7,-4) -
                0.3125*O(7,-2));
    *c_out++ = (-0.41339864235384227*O(7,0) - 0.5740991584648073*O(7,2) -
                0.5385527481129402*O(7,4) - 0.4576818286211503*O(7,6));
    *c_out++ = (0.6472598492877494*O(7,-7) + 0.47495887979908324*O(7,-5) +
                0.42961647140211*O(7,-3) + 0.41339864235384227*O(7,-1));
    *c_out++ = (-0.078125*O(7,1) - 0.24356964481437335*O(7,3) - 0.4487939567607835*O(7,5) -
                0.8562442974262661*O(7,7));
    *c_out++ = (-0.6991205412874092*O(7,-7) + 0.07328774624724109*O(7,-5) +
                0.41984465132951254*O(7,-3) + 0.5740991584648073*O(7,-1));
    *c_out++ = (-0.24356964481437335*O(7,1) - 0.609375*O(7,3) - 0.5700448858423344*O(7,5) +
                0.4943528756111367*O(7,7));
    *c_out++ = (0.2981060004427955*O(7,-7) - 0.78125*O(7,-5) - 0.10364452469860624*O(7,-3) +
                0.5385527481129402*O(7,-1));
    *c_out++ = (-0.4487939567607835*O(7,1) - 0.5700448858423344*O(7,3) + 0.671875*O(7,5) -
                0.14905300022139775*O(7,7));
    *c_out++ = (-0.05846339666834283*O(7,-7) + 0.3983608994994363*O(7,-5) -
                0.7927281808728639*O(7,-3) + 0.4576818286211503*O(7,-1));
    *c_out++ = (-0.8562442974262661*O(7,1) + 0.4943528756111367*O(7,3) -
                0.14905300022139775*O(7,5) + 0.015625*O(7,7));
    
    if (lmax < 8) return;
    *c_out++ = (-0.8356088723200586*O(8,1) + 0.516334738808072*O(8,3) -
                0.184877493221863*O(8,5) + 0.03125*O(8,7));
    *c_out++ = (-0.109375*O(8,-7) + 0.4621937330546575*O(8,-5) - 0.774502108212108*O(8,-3) +
                0.4178044361600293*O(8,-1));
    *c_out++ = (-0.4576818286211503*O(8,1) - 0.47134697278119864*O(8,3) +
                0.7088310138883598*O(8,5) - 0.2567449488305466*O(8,7));
    *c_out++ = (0.4621937330546575*O(8,-7) - 0.703125*O(8,-5) - 0.2181912506838897*O(8,-3) +
                0.4943528756111367*O(8,-1));
    *c_out++ = (-0.27421763710600383*O(8,1) - 0.6051536478449089*O(8,3) -
                0.33802043207474897*O(8,5) + 0.6665852814906732*O(8,7));
    *c_out++ = (-0.774502108212108*O(8,-7) - 0.2181912506838897*O(8,-5) +
                0.265625*O(8,-3) + 0.5310201708739509*O(8,-1));
    *c_out++ = (-0.1307281291459493*O(8,1) - 0.38081430021731066*O(8,3) -
                0.5908647000371574*O(8,5) - 0.6991205412874092*O(8,7));
    *c_out++ = (0.4178044361600293*O(8,-7) + 0.4943528756111367*O(8,-5) +
                0.5310201708739509*O(8,-3) + 0.546875*O(8,-1));
    *c_out++ = (0.2734375*O(8,0) + 0.3921843874378479*O(8,2) + 0.4113264556590057*O(8,4) +
                0.4576818286211503*O(8,6) + 0.626706654240044*O(8,8));
    *c_out++ = (0.8356088723200586*O(8,-8) + 0.4576818286211503*O(8,-6) +
                0.27421763710600383*O(8,-4) + 0.1307281291459493*O(8,-2));
    *c_out++ = (0.3921843874378479*O(8,0) + 0.5*O(8,2) + 0.32775276505317236*O(8,4) -
                0.6991205412874092*O(8,8));
    *c_out++ = (-0.516334738808072*O(8,-8) + 0.47134697278119864*O(8,-6) +
                0.6051536478449089*O(8,-4) + 0.38081430021731066*O(8,-2));
    *c_out++ = (0.4113264556590057*O(8,0) + 0.32775276505317236*O(8,2) -
                0.28125*O(8,4) - 0.7302075903467452*O(8,6) + 0.3332926407453366*O(8,8));
    *c_out++ = (0.184877493221863*O(8,-8) - 0.7088310138883598*O(8,-6) +
                0.33802043207474897*O(8,-4) + 0.5908647000371574*O(8,-2));
    *c_out++ = (0.4576818286211503*O(8,0) - 0.7302075903467452*O(8,4) + 0.5*O(8,6) -
                0.0855816496101822*O(8,8));
    *c_out++ = (-0.03125*O(8,-8) + 0.2567449488305466*O(8,-6) - 0.6665852814906732*O(8,-4) +
                0.6991205412874092*O(8,-2));
    *c_out++ = (0.626706654240044*O(8,0) - 0.6991205412874092*O(8,2) +
                0.3332926407453366*O(8,4) - 0.0855816496101822*O(8,6) + 0.0078125*O(8,8));
    
    if (lmax < 9) return;
    *c_out++ = (0.6090493921755238*O(9,0) - 0.6968469725305549*O(9,2) +
                0.3615761395439417*O(9,4) - 0.11158481919598204*O(9,6) + 0.016572815184059706*O(9,8));
    *c_out++ = (-0.0625*O(9,-8) + 0.3156095293238149*O(9,-6) - 0.6817945071647321*O(9,-4) +
                0.656993626300895*O(9,-2));
    *c_out++ = (0.44314852502786806*O(9,0) - 0.05633673867912483*O(9,2) - 0.6723290616859425*O(9,4) +
                0.5683291712335379*O(9,6) - 0.1594400908746762*O(9,8));
    *c_out++ = (0.3156095293238149*O(9,-8) - 0.71875*O(9,-6) + 0.20252314682524564*O(9,-4) +
                0.5854685623498499*O(9,-2));
    *c_out++ = (0.39636409043643195*O(9,0) + 0.25194555463432966*O(9,2) - 0.3921843874378479*O(9,4) -
                0.6051536478449089*O(9,6) + 0.509312687906457*O(9,8));
    *c_out++ = (-0.6817945071647321*O(9,-8) + 0.20252314682524564*O(9,-6) + 0.5625*O(9,-4) +
                0.4215855488510013*O(9,-2));
    *c_out++ = (0.3754879637718099*O(9,0) + 0.42961647140211*O(9,2) + 0.13799626353637262*O(9,4) -
                0.2981060004427955*O(9,6) - 0.7526807559068452*O(9,8));
    *c_out++ = (0.656993626300895*O(9,-8) + 0.5854685623498499*O(9,-6) + 0.4215855488510013*O(9,-4) +
                0.21875*O(9,-2));
    *c_out++ = (0.36685490255855924*O(9,0) + 0.5130142237306876*O(9,2) + 0.4943528756111367*O(9,4) +
                0.4576818286211503*O(9,6) + 0.38519665736315783*O(9,8));
    *c_out++ = (-0.6090493921755238*O(9,-9) - 0.44314852502786806*O(9,-7) - 0.39636409043643195*O(9,-5) -
                0.3754879637718099*O(9,-3) - 0.36685490255855924*O(9,-1));
    *c_out++ = (0.0546875*O(9,1) + 0.16792332234534904*O(9,3) + 0.2954323500185787*O(9,5) +
                0.4624247721758373*O(9,7) + 0.8171255055356398*O(9,9));
    *c_out++ = (0.6968469725305549*O(9,-9) + 0.05633673867912483*O(9,-7) - 0.25194555463432966*O(9,-5) -
                0.42961647140211*O(9,-3) - 0.5130142237306876*O(9,-1));
    *c_out++ = (0.16792332234534904*O(9,1) + 0.453125*O(9,3) + 0.577279787559724*O(9,5) +
                0.387251054106054*O(9,7) - 0.5322256665703469*O(9,9));
    *c_out++ = (-0.3615761395439417*O(9,-9) + 0.6723290616859425*O(9,-7) + 0.3921843874378479*O(9,-5) -
                0.13799626353637262*O(9,-3) - 0.4943528756111367*O(9,-1));
    *c_out++ = (0.2954323500185787*O(9,1) + 0.577279787559724*O(9,3) + 0.140625*O(9,5) -
                0.7162405240429014*O(9,7) + 0.21608307321780204*O(9,9));
    *c_out++ = (0.11158481919598204*O(9,-9) - 0.5683291712335379*O(9,-7) + 0.6051536478449089*O(9,-5) +
                0.2981060004427955*O(9,-3) - 0.4576818286211503*O(9,-1));
    *c_out++ = (0.4624247721758373*O(9,1) + 0.387251054106054*O(9,3) - 0.7162405240429014*O(9,5) +
                0.34765625*O(9,7) - 0.048317644050206957*O(9,9));
    *c_out++ = (-0.016572815184059706*O(9,-9) + 0.1594400908746762*O(9,-7) - 0.509312687906457*O(9,-5) +
                0.7526807559068452*O(9,-3) - 0.38519665736315783*O(9,-1));
    *c_out++ = (0.8171255055356398*O(9,1) - 0.5322256665703469*O(9,3) + 0.21608307321780204*O(9,5) -
                0.048317644050206957*O(9,7) + 0.00390625*O(9,9));
    assert(lmax < 10);
    
#if 0
    if (lmax < 10) return;
    *c_out++ = (0.800447720175637*O(10,1) - 0.5437971423529642*O(10,3) + 0.24319347525427157*O(10,5) -
                0.06594508990677396*O(10,7) + 0.008734640537108554*O(10,9));
    *c_out++ = (-0.03515625*O(10,-9) + 0.20644078533943455*O(10,-7) - 0.5437971423529642*O(10,-5) +
                0.7295804257628147*O(10,-3) - 0.35797110294949086*O(10,-1));
    *c_out++ = (0.4645646483537033*O(10,1) + 0.3156095293238149*O(10,3) - 0.7057243619147634*O(10,5) +
                0.4210060495408587*O(10,7) - 0.09631896879639025*O(10,9));
    *c_out++ = (0.20644078533943455*O(10,-9) - 0.62890625*O(10,-7) + 0.5041938375082048*O(10,-5) +
                0.3543293897015177*O(10,-3) - 0.4267298778757763*O(10,-1));
    *c_out++ = (0.31049159295683837*O(10,1) + 0.5390625*O(10,3) - 0.017469281074217108*O(10,5) -
                0.6925528980529664*O(10,7) + 0.36479021288140734*O(10,9));
    *c_out++ = (-0.5437971423529642*O(10,-9) + 0.5041938375082048*O(10,-7) + 0.484375*O(10,-5) -
                0.034938562148434216*O(10,-3) - 0.46285353886245695*O(10,-1));
    *c_out++ = (0.19515618744994995*O(10,1) + 0.48613591206575135*O(10,3) + 0.4941058844013093*O(10,5) +
                0.09110862335695782*O(10,7) - 0.6878550219704731*O(10,9));
    *c_out++ = (0.7295804257628147*O(10,-9) + 0.3543293897015177*O(10,-7) - 0.034938562148434216*O(10,-5) -
                0.328125*O(10,-3) - 0.4829869223773042*O(10,-1));
    *c_out++ = (0.09472152853892297*O(10,1) + 0.2788526296496054*O(10,3) + 0.44538102542935076*O(10,5) +
                0.5748694230132831*O(10,7) + 0.6200241379499873*O(10,9));
    *c_out++ = (-0.35797110294949086*O(10,-9) - 0.4267298778757763*O(10,-7) - 0.46285353886245695*O(10,-5) -
                0.4829869223773042*O(10,-3) - 0.4921875*O(10,-1));
    *c_out++ = (-0.24609375*O(10,0) - 0.3512368283228746*O(10,2) - 0.3618292555284191*O(10,4) -
                0.3837778803237379*O(10,6) - 0.4306629552848579*O(10,8) - 0.5936279171365733*O(10,10));
    *c_out++ = (-0.800447720175637*O(10,-10) - 0.4645646483537033*O(10,-8) - 0.31049159295683837*O(10,-6) -
                0.19515618744994995*O(10,-4) - 0.09472152853892297*O(10,-2));
    *c_out++ = (-0.3512368283228746*O(10,0) - 0.46484375*O(10,2) - 0.36618880141431137*O(10,4) -
                0.18922142726223223*O(10,6) + 0.10058119679362292*O(10,8) + 0.6932080600734395*O(10,10));
    *c_out++ = (0.5437971423529642*O(10,-10) - 0.3156095293238149*O(10,-8) - 0.5390625*O(10,-6) -
                0.48613591206575135*O(10,-4) - 0.2788526296496054*O(10,-2));
    *c_out++ = (-0.3618292555284191*O(10,0) - 0.36618880141431137*O(10,2) + 0.015625*O(10,4) +
                0.4585145534256519*O(10,6) + 0.6137165055779013*O(10,8) - 0.38452264694764726*O(10,10));
    *c_out++ = (-0.24319347525427157*O(10,-10) + 0.7057243619147634*O(10,-8) + 0.017469281074217108*O(10,-6) -
                0.4941058844013093*O(10,-4) - 0.44538102542935076*O(10,-2));
    *c_out++ = (-0.3837778803237379*O(10,0) - 0.18922142726223223*O(10,2) + 0.4585145534256519*O(10,4) +
                0.462890625*O(10,6) - 0.6114934630648914*O(10,8) + 0.13594928558824104*O(10,10));
    *c_out++ = (0.06594508990677396*O(10,-10) - 0.4210060495408587*O(10,-8) + 0.6925528980529664*O(10,-6) -
                0.09110862335695782*O(10,-4) - 0.5748694230132831*O(10,-2));
    *c_out++ = (-0.4306629552848579*O(10,0) + 0.10058119679362292*O(10,2) + 0.6137165055779013*O(10,4) -
                0.6114934630648914*O(10,6) + 0.23046875*O(10,8) - 0.026921970218926214*O(10,10));
    *c_out++ = (-0.008734640537108554*O(10,-10) + 0.09631896879639025*O(10,-8) - 0.36479021288140734*O(10,-6) +
                0.6878550219704731*O(10,-4) - 0.6200241379499873*O(10,-2));
    *c_out++ = (-0.5936279171365733*O(10,0) + 0.6932080600734395*O(10,2) - 0.38452264694764726*O(10,4) +
                0.13594928558824104*O(10,6) - 0.026921970218926214*O(10,8) + 0.001953125*O(10,10));
#endif
#undef O
}